

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.cpp
# Opt level: O3

bool wasm::isDebugEnabled(char *type)

{
  const_iterator cVar1;
  bool bVar2;
  key_type local_38;
  allocator<char> local_11;
  
  if (debugEnabled == '\x01') {
    if (debugTypesEnabled_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
      bVar2 = true;
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,type,&local_11);
      cVar1 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::find(&debugTypesEnabled_abi_cxx11_._M_t,&local_38);
      bVar2 = (_Rb_tree_header *)cVar1._M_node !=
              &debugTypesEnabled_abi_cxx11_._M_t._M_impl.super__Rb_tree_header;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_38._M_dataplus._M_p != &local_38.field_2) {
        operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
      }
    }
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool wasm::isDebugEnabled(const char* type) {
  if (!debugEnabled) {
    return false;
  }
  if (debugTypesEnabled.empty()) {
    return true;
  }
  return debugTypesEnabled.count(type) > 0;
}